

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O3

void __thiscall
FactorisedJoin::getRelationOrdering(FactorisedJoin *this,int *left,DTreeNode *node,int *ordering)

{
  double dVar1;
  int iVar2;
  Database pTVar3;
  pointer ppVar4;
  long lVar5;
  pointer ppVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> values;
  allocator_type local_41;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  iVar2 = node->_id;
  uVar9 = (uint)((ulong)((long)this->_ids[iVar2].
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)this->_ids[iVar2].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (uVar9 == 1) {
    *ordering = 0;
  }
  else {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&local_40,(long)(int)uVar9,&local_41);
    ppVar6 = local_40.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)uVar9) {
      pTVar3 = this->_data;
      ppVar4 = this->_ids[iVar2].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar7 = &(local_40.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      uVar8 = 0;
      do {
        iVar2 = ppVar4[uVar8].first;
        dVar1 = pTVar3[iVar2].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start[left[iVar2]][ppVar4[uVar8].second];
        ((pair<int,_double> *)(pdVar7 + -1))->first = (int)uVar8;
        *pdVar7 = dVar1;
        uVar8 = uVar8 + 1;
        pdVar7 = pdVar7 + 2;
      } while ((uVar9 & 0x7fffffff) != uVar8);
    }
    if (local_40.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_40.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      uVar8 = (long)local_40.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_40.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::sort_pred>>
                (local_40.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_40.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::sort_pred>>
                (ppVar6,local_40.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((int)uVar9 < 1) {
      if (local_40.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
    }
    else {
      uVar8 = 0;
      ppVar6 = local_40.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        ordering[uVar8] = ppVar6->first;
        uVar8 = uVar8 + 1;
        ppVar6 = ppVar6 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar8);
    }
    operator_delete(local_40.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FactorisedJoin::getRelationOrdering(int* left, DTreeNode* node, int* ordering)
{
    int nodeID = node->_id;
    int numberOfRelations = _ids[nodeID].size();

    if (numberOfRelations == 1)
    {
        ordering[0] = 0;
        return;
    }

    vector<pair<int, double> > values(numberOfRelations);

    for (int k = 0; k < numberOfRelations; ++k)
    {
        int i = _ids[nodeID][k].first;
        int j = _ids[nodeID][k].second;
        values[k] = make_pair(k, _data[i][left[i]][j]);
    }

    sort(values.begin(), values.end(), sort_pred());

    for (int k = 0; k < numberOfRelations; ++k)
        ordering[k] = values[k].first;
}